

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O0

void __thiscall
TI::TMS::SpriteFetcher<(TI::TMS::Personality)4,_(TI::TMS::SpriteMode)0>::fetch_image
          (SpriteFetcher<(TI::TMS::Personality)4,_(TI::TMS::SpriteMode)0> *this,int slot,
          uint8_t name)

{
  Base<(TI::TMS::Personality)4> *pBVar1;
  unsigned_short uVar2;
  int iVar3;
  reference pvVar4;
  ushort uVar5;
  ActiveSprite *this_00;
  AddressT graphic_location;
  ActiveSprite *sprite;
  uint8_t colour;
  uint8_t name_local;
  int slot_local;
  SpriteFetcher<(TI::TMS::Personality)4,_(TI::TMS::SpriteMode)0> *this_local;
  
  this_00 = this->base->fetch_sprite_buffer_->active_sprites + slot;
  pBVar1 = this->base;
  uVar5 = this->base->sprite_attribute_table_address_;
  uVar2 = bits<7,unsigned_short>((ushort)(this_00->index << 2) | 3);
  pvVar4 = std::array<unsigned_char,_16384UL>::operator[]
                     (&pBVar1->ram_,(long)(int)(uint)(uVar5 & uVar2));
  this_00->image[2] = *pvVar4;
  iVar3 = SpriteBuffer::ActiveSprite::early_clock(this_00);
  this_00->x = this_00->x - iVar3;
  uVar5 = this->base->sprite_generator_table_address_;
  uVar2 = bits<11,unsigned_short>((ushort)name << 3 | (ushort)this_00->row);
  uVar5 = uVar5 & uVar2;
  pvVar4 = std::array<unsigned_char,_16384UL>::operator[](&this->base->ram_,(ulong)uVar5);
  this_00->image[0] = *pvVar4;
  pvVar4 = std::array<unsigned_char,_16384UL>::operator[]
                     (&this->base->ram_,(long)(int)(uVar5 + 0x10));
  this_00->image[1] = *pvVar4;
  if (slot == 3) {
    this->base->fetch_sprite_buffer_->is_filling = false;
  }
  return;
}

Assistant:

void fetch_image(int slot, uint8_t name) {
			uint8_t colour = 0;
			auto &sprite = base->fetch_sprite_buffer_->active_sprites[slot];
			switch(mode) {
				case SpriteMode::Mode1:
					// Fetch colour from the attribute table, per this sprite's slot.
					colour = base->ram_[
						base->sprite_attribute_table_address_ & bits<7>(AddressT((sprite.index << 2) | 3))
					];
				break;

				case SpriteMode::Mode2: {
					// Fetch colour from the colour table, per this sprite's slot and row.
					const AddressT colour_table_address = (base->sprite_attribute_table_address_ | ~AttributeAddressMask) & AddressT(~0x200);
					colour = base->ram_[
						colour_table_address &
						bits<9>(
							AddressT(sprite.index << 4) |
							AddressT(sprite.row)
						)
					];
				} break;
			}
			sprite.image[2] = colour;
			sprite.x -= sprite.early_clock();

			const AddressT graphic_location = base->sprite_generator_table_address_ & bits<11>(AddressT((name << 3) | sprite.row));
			sprite.image[0] = base->ram_[graphic_location];
			sprite.image[1] = base->ram_[graphic_location+16];

			if constexpr (SpriteBuffer::test_is_filling) {
				if(slot == ((mode == SpriteMode::Mode2) ? 7 : 3)) {
					base->fetch_sprite_buffer_->is_filling = false;
				}
			}
		}